

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Read_2(ON_Mesh *this,int vcount,ON_BinaryArchive *file)

{
  size_t sVar1;
  ON_BinaryArchive *pOVar2;
  int iVar3;
  ON_3fPoint *pOVar4;
  ON_3fVector *pOVar5;
  ON_2fPoint *pOVar6;
  ON_SurfaceCurvature *pOVar7;
  ON_Color *pOVar8;
  ON_3fPoint *dst;
  ON_3fVector *dst_00;
  ON_2fPoint *dst_01;
  ON_SurfaceCurvature *dst_02;
  ON_Color *dst_03;
  bool local_31;
  size_t sStack_30;
  bool bFailedCRC;
  size_t sz;
  bool rc;
  ON_BinaryArchive *pOStack_20;
  endian e;
  ON_BinaryArchive *file_local;
  ON_Mesh *pOStack_10;
  int vcount_local;
  ON_Mesh *this_local;
  
  pOStack_20 = file;
  file_local._4_4_ = vcount;
  pOStack_10 = this;
  sz._4_4_ = ON_BinaryArchive::Endian(file);
  sz._3_1_ = 1;
  if (0 < file_local._4_4_) {
    sStack_30 = 0;
    sz._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize(pOStack_20,&stack0xffffffffffffffd0);
    if (((bool)sz._3_1_) && (sStack_30 != 0)) {
      if (sStack_30 == (long)file_local._4_4_ * 0xc) {
        ON_SimpleArray<ON_3fPoint>::SetCapacity
                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,(long)file_local._4_4_);
        pOVar2 = pOStack_20;
        sVar1 = sStack_30;
        if ((sz._3_1_ & 1) != 0) {
          pOVar4 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
          sz._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar4,&local_31);
        }
        if ((sz._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_3fPoint>::SetCount
                    (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,file_local._4_4_);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x74a,"","ON_Mesh::Read - compressed vertex point buffer size is wrong.");
        sz._3_1_ = 0;
      }
    }
    sStack_30 = 0;
    if ((sz._3_1_ & 1) != 0) {
      sz._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize(pOStack_20,&stack0xffffffffffffffd0);
    }
    if (((sz._3_1_ & 1) != 0) && (sStack_30 != 0)) {
      if (sStack_30 == (long)file_local._4_4_ * 0xc) {
        ON_SimpleArray<ON_3fVector>::SetCapacity
                  (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,(long)file_local._4_4_);
        pOVar2 = pOStack_20;
        sVar1 = sStack_30;
        if ((sz._3_1_ & 1) != 0) {
          pOVar5 = ON_SimpleArray<ON_3fVector>::Array
                             (&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
          sz._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar5,&local_31);
        }
        if ((sz._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_3fVector>::SetCount
                    (&(this->m_N).super_ON_SimpleArray<ON_3fVector>,file_local._4_4_);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x75b,"","ON_Mesh::Read - compressed vertex normal buffer size is wrong.");
        sz._3_1_ = 0;
      }
    }
    sStack_30 = 0;
    if ((sz._3_1_ & 1) != 0) {
      sz._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize(pOStack_20,&stack0xffffffffffffffd0);
    }
    if (((sz._3_1_ & 1) != 0) && (sStack_30 != 0)) {
      if (sStack_30 == (long)file_local._4_4_ * 8) {
        ON_SimpleArray<ON_2fPoint>::SetCapacity
                  (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,(long)file_local._4_4_);
        pOVar2 = pOStack_20;
        sVar1 = sStack_30;
        if ((sz._3_1_ & 1) != 0) {
          pOVar6 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
          sz._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar6,&local_31);
        }
        if ((sz._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_2fPoint>::SetCount
                    (&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,file_local._4_4_);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x76c,"","ON_Mesh::Read - compressed texture coordinate buffer size is wrong.");
        sz._3_1_ = 0;
      }
    }
    sStack_30 = 0;
    if ((sz._3_1_ & 1) != 0) {
      sz._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize(pOStack_20,&stack0xffffffffffffffd0);
    }
    if (((sz._3_1_ & 1) != 0) && (sStack_30 != 0)) {
      if (sStack_30 == (long)file_local._4_4_ * 0x10) {
        ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&this->m_K,(long)file_local._4_4_);
        pOVar2 = pOStack_20;
        sVar1 = sStack_30;
        if ((sz._3_1_ & 1) != 0) {
          pOVar7 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
          sz._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar7,&local_31);
        }
        if ((sz._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_SurfaceCurvature>::SetCount(&this->m_K,file_local._4_4_);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x77d,"","ON_Mesh::Read - compressed vertex curvature buffer size is wrong.");
        sz._3_1_ = 0;
      }
    }
    sStack_30 = 0;
    if ((sz._3_1_ & 1) != 0) {
      sz._3_1_ = ON_BinaryArchive::ReadCompressedBufferSize(pOStack_20,&stack0xffffffffffffffd0);
    }
    if (((sz._3_1_ & 1) != 0) && (sStack_30 != 0)) {
      if (sStack_30 == (long)file_local._4_4_ * 4) {
        ON_SimpleArray<ON_Color>::SetCapacity(&this->m_C,(long)file_local._4_4_);
        pOVar2 = pOStack_20;
        sVar1 = sStack_30;
        if ((sz._3_1_ & 1) != 0) {
          pOVar8 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
          sz._3_1_ = ON_BinaryArchive::ReadCompressedBuffer(pOVar2,sVar1,pOVar8,&local_31);
        }
        if ((sz._3_1_ & 1) != 0) {
          ON_SimpleArray<ON_Color>::SetCount(&this->m_C,file_local._4_4_);
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                   ,0x78e,"","ON_Mesh::Read - compressed vertex color buffer size is wrong.");
        sz._3_1_ = 0;
      }
    }
    if (sz._4_4_ == big_endian) {
      iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      pOVar4 = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      dst = ON_SimpleArray<ON_3fPoint>::Array(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
      ON_BinaryArchive::ToggleByteOrder((long)(iVar3 * 3),4,pOVar4,dst);
      iVar3 = ON_SimpleArray<ON_3fVector>::Count(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      pOVar5 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      dst_00 = ON_SimpleArray<ON_3fVector>::Array(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
      ON_BinaryArchive::ToggleByteOrder((long)(iVar3 * 3),4,pOVar5,dst_00);
      iVar3 = ON_SimpleArray<ON_2fPoint>::Count(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      pOVar6 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      dst_01 = ON_SimpleArray<ON_2fPoint>::Array(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
      ON_BinaryArchive::ToggleByteOrder((long)(iVar3 << 1),4,pOVar6,dst_01);
      iVar3 = ON_SimpleArray<ON_SurfaceCurvature>::Count(&this->m_K);
      pOVar7 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
      dst_02 = ON_SimpleArray<ON_SurfaceCurvature>::Array(&this->m_K);
      ON_BinaryArchive::ToggleByteOrder((long)(iVar3 << 1),8,pOVar7,dst_02);
      iVar3 = ON_SimpleArray<ON_Color>::Count(&this->m_C);
      pOVar8 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
      dst_03 = ON_SimpleArray<ON_Color>::Array(&this->m_C);
      ON_BinaryArchive::ToggleByteOrder((long)(iVar3 * 3),4,pOVar8,dst_03);
    }
  }
  return (bool)(sz._3_1_ & 1);
}

Assistant:

bool ON_Mesh::Read_2( int vcount, ON_BinaryArchive& file )
{
  // common to all 2.x formats (compressed)
  const ON::endian e = file.Endian();

  bool rc = true;


  if ( vcount > 0 ) 
  {
    size_t sz = 0;
    bool bFailedCRC;

    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_V[0]) )
      {
        m_V.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_V.Array(),&bFailedCRC);
        if (rc) m_V.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex point buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }

    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_N[0]) )
      {
        m_N.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_N.Array(),&bFailedCRC );
        if (rc) m_N.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex normal buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_T[0]) )
      {
        m_T.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_T.Array(),&bFailedCRC );
        if (rc) m_T.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed texture coordinate buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_K[0]) )
      {
        m_K.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_K.Array(),&bFailedCRC );
        if (rc) m_K.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex curvature buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    sz = 0;
    if (rc) rc = file.ReadCompressedBufferSize( &sz );
    if (rc && sz) 
    {
      if ( sz == vcount*sizeof(m_C[0]) )
      {
        m_C.SetCapacity(vcount);
        if (rc) rc = file.ReadCompressedBuffer( sz,m_C.Array(),&bFailedCRC );
        if (rc) m_C.SetCount(vcount);
      }
      else
      {
        ON_ERROR("ON_Mesh::Read - compressed vertex color buffer size is wrong.");
        rc = false; // buffer is wrong size
      }
    }
    
    if (e == ON::endian::big_endian)
    {
      // This code assumes sizeof(ON_Color)=4, sizeof(float)=4 
      // and sizeof(double)=8.
      // If this is not the case, then changing the 4's and 8's below
      // will not work.  You will have to read the compressed
      // information into temporary arrays of 4 byte floats/8 byte doubles
      // and then convert those numbers to whatever is stored in the
      // m_V[], m_N[], m_T[], m_K[] and m_C[] arrays/
      file.ToggleByteOrder( m_V.Count()*3, 4, m_V.Array(), (void*)m_V.Array() );
      file.ToggleByteOrder( m_N.Count()*3, 4, m_N.Array(), (void*)m_N.Array() );
      file.ToggleByteOrder( m_T.Count()*2, 4, m_T.Array(), (void*)m_T.Array() );
      file.ToggleByteOrder( m_K.Count()*2, 8, m_K.Array(), (void*)m_K.Array() );
      file.ToggleByteOrder( m_C.Count()*3, 4, m_C.Array(), (void*)m_C.Array() );
    }
  }

  return rc;
}